

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O2

uLong adler32_combine_(uLong adler1,uLong adler2,long len2)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (-1 < len2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = len2;
    iVar2 = (int)(adler1 & 0xffff);
    lVar5 = (((adler2 >> 0x10 & 0xffff) + (adler1 >> 0x10 & 0xffff)) -
            SUB168(auVar1 % ZEXT816(0xfff1),0)) +
            (ulong)(uint)(iVar2 * SUB164(auVar1 % ZEXT816(0xfff1),0)) % 0xfff1;
    uVar3 = lVar5 + 0xfff1;
    uVar4 = 0xfff0;
    if (0xfff0 < iVar2 + (int)(adler2 & 0xffff) + 0xfff0U) {
      uVar4 = ((adler1 & 0xffff) + (adler2 & 0xffff)) - 1;
    }
    uVar6 = uVar4 - 0xfff1;
    if (uVar4 < 0xfff1) {
      uVar6 = uVar4;
    }
    uVar4 = lVar5 - 0xfff1;
    if (uVar3 < 0x1ffe2) {
      uVar4 = uVar3;
    }
    uVar3 = uVar4 * 0x10000 - 0xfff10000;
    if (uVar4 < 0xfff1) {
      uVar3 = uVar4 * 0x10000;
    }
    return uVar3 | uVar6;
  }
  return 0xffffffff;
}

Assistant:

local uLong adler32_combine_(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off64_t len2;
{
    unsigned long sum1;
    unsigned long sum2;
    unsigned rem;

    /* for negative len, return invalid adler32 as a clue for debugging */
    if (len2 < 0)
        return 0xffffffffUL;

    /* the derivation of this formula is left as an exercise for the reader */
    MOD63(len2);                /* assumes len2 >= 0 */
    rem = (unsigned)len2;
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum1 >= BASE) sum1 -= BASE;
    if (sum2 >= ((unsigned long)BASE << 1)) sum2 -= ((unsigned long)BASE << 1);
    if (sum2 >= BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}